

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O2

void __thiscall io_buf::~io_buf(io_buf *this)

{
  ~io_buf(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~io_buf()
  {
    files.delete_v();
    space.delete_v();
  }